

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O1

int get_token_from_fp(FILE *fp,char *buff,char d)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  *buff = '\0';
  iVar2 = feof((FILE *)fp);
  if (iVar2 == 0) {
    uVar3 = fgetc((FILE *)fp);
    uVar1 = (uint)(byte)d;
    iVar2 = 0;
    if ((int)(char)uVar3 != uVar1) {
      if ((char)uVar3 == '\n' || (uVar3 & 0xfb) == 9) {
        do {
          iVar2 = feof((FILE *)fp);
          if (iVar2 != 0) goto LAB_00146f1b;
          uVar3 = getc((FILE *)fp);
        } while ((uVar3 & 0xfb) == 9 || (char)uVar3 == '\n');
      }
      uVar4 = 0;
      if ((((uVar3 & 0xfb) != 9) && ((uVar3 & 0xff) != 10)) && ((int)(char)uVar3 != uVar1)) {
        uVar4 = 0;
        while( true ) {
          iVar2 = feof((FILE *)fp);
          if (iVar2 != 0) break;
          buff[uVar4] = (char)uVar3;
          uVar3 = fgetc((FILE *)fp);
          uVar4 = uVar4 + 1;
          if ((((uVar3 & 0xfb) == 9) || ((uVar3 & 0xff) == 10)) || ((int)(char)uVar3 == uVar1))
          break;
        }
      }
      iVar2 = (int)uVar4;
      buff = buff + (uVar4 & 0xffffffff);
    }
    *buff = '\0';
  }
  else {
LAB_00146f1b:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int get_token_from_fp(FILE * fp, char *buff, char d)
{
   char c;
   int i;

   buff[0] = '\0';

   if (feof(fp))
      return 0;
   c = fgetc(fp);
   if (c == d) {
      buff[0] = '\0';
      return 0;
   }

   while (c == '\n' || c == '\r' || c == '\t') {
      if (feof(fp))
         return 0;
      c = getc(fp);
   }

   for (i = 0; c != d && c != '\n' && c != '\r' && c != '\t' && !feof(fp); i++) {
      buff[i] = c;
      c = fgetc(fp);
   }

   buff[i] = '\0';
   return i;
}